

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cc
# Opt level: O0

code_point_t onmt::unicode::utf8_to_cp(char *str,size_t *length)

{
  int32_t iVar1;
  int iVar2;
  uint8_t __t;
  int32_t offset;
  UChar32 c;
  size_t *length_local;
  char *str_local;
  
  offset = 1;
  c = (UChar32)(byte)*str;
  iVar1 = 1;
  if ((*str & 0x80U) == 0) goto LAB_003d5a40;
  if ((uint)c < 0xe0) {
    if (0xc1 < (uint)c) {
      c = c & 0x1f;
LAB_003d59f0:
      if ((byte)(str[offset] + 0x80U) < 0x40) {
        c = c << 6 | (uint)(byte)(str[offset] + 0x80U);
        iVar1 = offset + 1;
        goto LAB_003d5a40;
      }
    }
  }
  else if ((uint)c < 0xf0) {
    c = c & 0xf;
    if (((int)" 000000000000\x1000"[c] & 1 << (sbyte)((int)(uint)(byte)str[1] >> 5)) != 0) {
      __t = str[1] & 0x3f;
LAB_003d59af:
      offset = iVar1;
      c = c << 6 | (uint)__t;
      offset = offset + 1;
      if (offset != -1) goto LAB_003d59f0;
    }
  }
  else {
    iVar2 = c - 0xf0;
    if ((iVar2 < 5) && (((int)""[(int)(uint)(byte)str[1] >> 4] & 1 << ((byte)iVar2 & 0x1f)) != 0)) {
      c = iVar2 * 0x40 | (byte)str[1] & 0x3f;
      offset = 2;
      __t = str[2] + 0x80;
      iVar1 = 2;
      if (__t < 0x40) goto LAB_003d59af;
    }
  }
  c = -1;
  iVar1 = offset;
LAB_003d5a40:
  offset = iVar1;
  if (c < 0) {
    c = 0;
    offset = 0;
  }
  if (length != (size_t *)0x0) {
    *length = (long)offset;
  }
  return c;
}

Assistant:

code_point_t utf8_to_cp(const char* str, size_t* length)
    {
      UChar32 c = -1;
      int32_t offset = 0;
      U8_NEXT(str, offset, -1, c);
      if (c < 0)
      {
        c = 0;
        offset = 0;
      }
      if (length)
        *length = offset;
      return c;
    }